

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v8::format_system_error(buffer<char> *out,int error_code,char *message)

{
  error_code __ec;
  error_category *__cat;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar1;
  int in_ESI;
  error_code ec;
  buffer<char> *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff60;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_ffffffffffffff68;
  system_error local_70 [24];
  char *in_stack_ffffffffffffffa8;
  system_error *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  error_code local_38 [3];
  
  __cat = (error_category *)std::_V2::generic_category();
  std::error_code::error_code(local_38,in_ESI,__cat);
  bVar1 = std::back_inserter<fmt::v8::detail::buffer<char>>(in_stack_ffffffffffffff28);
  __ec._M_cat = (error_category *)bVar1.container;
  __ec._0_8_ = in_stack_ffffffffffffffb8;
  std::system_error::system_error(in_stack_ffffffffffffffb0,__ec,in_stack_ffffffffffffffa8);
  std::runtime_error::what();
  detail::write<char,std::back_insert_iterator<fmt::v8::detail::buffer<char>>>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::system_error::~system_error(local_70);
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  const char* message) FMT_NOEXCEPT {
  FMT_TRY {
    auto ec = std::error_code(error_code, std::generic_category());
    write(std::back_inserter(out), std::system_error(ec, message).what());
    return;
  }